

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O1

void __thiscall
aeron::ClientConductor::onAvailableImage
          (ClientConductor *this,int32_t streamId,int32_t sessionId,string *logFilename,
          string *sourceIdentity,int32_t subscriberPositionIndicatorId,
          int64_t subscriberPositionRegistrationId,int64_t correlationId)

{
  int iVar1;
  pointer pSVar2;
  Subscription *this_00;
  __pointer_type pIVar3;
  ulong uVar4;
  Image *pIVar5;
  long lVar6;
  int64_t subscriptionRegistrationId;
  int iVar7;
  ImageList *pIVar8;
  int64_t *piVar9;
  ulong uVar10;
  ulong uVar11;
  pointer pSVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar13;
  shared_ptr<aeron::LogBuffers> logBuffers;
  shared_ptr<aeron::LogBuffers> local_1c8;
  vector<aeron::ClientConductor::ImageListLingerDefn,std::allocator<aeron::ClientConductor::ImageListLingerDefn>>
  *local_1b8;
  _Any_data *local_1b0;
  _func_int **local_1a8;
  exception_handler_t *local_1a0;
  string *local_198;
  string *local_190;
  ImageList *local_188;
  longlong local_180;
  UnsafeBufferPosition subscriberPosition;
  Image image;
  
  local_198 = sourceIdentity;
  local_190 = logFilename;
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  pSVar12 = (this->m_subscriptions).
            super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar12 != pSVar2) {
    local_1a0 = &this->m_errorHandler;
    local_1b0 = (_Any_data *)&this->m_epochClock;
    local_1b8 = (vector<aeron::ClientConductor::ImageListLingerDefn,std::allocator<aeron::ClientConductor::ImageListLingerDefn>>
                 *)&this->m_lingeringImageLists;
    local_1a8 = (_func_int **)&PTR__AtomicBuffer_00162160;
    do {
      if (pSVar12->m_streamId == streamId) {
        this_01 = (pSVar12->m_subscription).
                  super___weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar7 = this_01->_M_use_count;
          do {
            if (iVar7 == 0) {
              this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              break;
            }
            LOCK();
            iVar1 = this_01->_M_use_count;
            bVar13 = iVar7 == iVar1;
            if (bVar13) {
              this_01->_M_use_count = iVar7 + 1;
              iVar1 = iVar7;
            }
            iVar7 = iVar1;
            UNLOCK();
          } while (!bVar13);
        }
        if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar13 = true;
        }
        else {
          bVar13 = this_01->_M_use_count == 0;
        }
        if ((!bVar13) &&
           (this_00 = (pSVar12->m_subscription).
                      super___weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           this_00 != (Subscription *)0x0)) {
          pIVar3 = (this_00->m_imageList)._M_b._M_p;
          uVar4 = pIVar3->m_length;
          bVar13 = uVar4 != 0;
          if (bVar13) {
            pIVar5 = pIVar3->m_images;
            if (pIVar5->m_correlationId == correlationId) goto LAB_00141846;
            piVar9 = &pIVar5[1].m_correlationId;
            uVar10 = 0;
            do {
              uVar11 = uVar4;
              if (uVar4 - 1 == uVar10) break;
              uVar11 = uVar10 + 1;
              lVar6 = *piVar9;
              piVar9 = piVar9 + 0x25;
              uVar10 = uVar11;
            } while (lVar6 != correlationId);
            bVar13 = uVar11 < uVar4;
          }
          if ((!bVar13) && (this_00->m_registrationId == subscriberPositionRegistrationId)) {
            image._vptr_Image = (_func_int **)(local_190->_M_dataplus)._M_p;
            logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<aeron::LogBuffers,std::allocator<aeron::LogBuffers>,char_const*>
                      (&logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,(LogBuffers **)&logBuffers,
                       (allocator<aeron::LogBuffers> *)&subscriberPosition,(char **)&image);
            subscriberPosition.m_buffer._vptr_AtomicBuffer = local_1a8;
            subscriberPosition.m_buffer.m_length = this->m_counterValuesBuffer->m_length;
            subscriberPosition.m_buffer.m_buffer = this->m_counterValuesBuffer->m_buffer;
            subscriptionRegistrationId = this_00->m_registrationId;
            local_1c8.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            ;
            local_1c8.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
            if (logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            subscriberPosition.m_id = subscriberPositionIndicatorId;
            subscriberPosition.m_offset = subscriberPositionIndicatorId << 7;
            Image::Image(&image,sessionId,correlationId,subscriptionRegistrationId,local_198,
                         &subscriberPosition,&local_1c8,local_1a0);
            if (local_1c8.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1c8.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if ((pSVar12->m_onAvailableImageHandler).super__Function_base._M_manager ==
                (_Manager_type)0x0) {
              std::__throw_bad_function_call();
            }
            (*(pSVar12->m_onAvailableImageHandler)._M_invoker)
                      ((_Any_data *)&pSVar12->m_onAvailableImageHandler,&image);
            pIVar8 = Subscription::addImage(this_00,&image);
            if (pIVar8 != (ImageList *)0x0) {
              if ((this->m_epochClock).super__Function_base._M_manager == (_Manager_type)0x0) {
                std::__throw_bad_function_call();
              }
              local_180 = (*(this->m_epochClock)._M_invoker)(local_1b0);
              local_188 = pIVar8;
              std::
              vector<aeron::ClientConductor::ImageListLingerDefn,std::allocator<aeron::ClientConductor::ImageListLingerDefn>>
              ::emplace_back<long_long&,aeron::ImageList*&>(local_1b8,&local_180,&local_188);
            }
            Image::~Image(&image);
            if (logBuffers.super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (logBuffers.
                         super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
        }
LAB_00141846:
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
      }
      pSVar12 = pSVar12 + 1;
    } while (pSVar12 != pSVar2);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::onAvailableImage(
    std::int32_t streamId,
    std::int32_t sessionId,
    const std::string &logFilename,
    const std::string &sourceIdentity,
    std::int32_t subscriberPositionIndicatorId,
    std::int64_t subscriberPositionRegistrationId,
    std::int64_t correlationId)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    std::for_each(m_subscriptions.begin(), m_subscriptions.end(),
        [&](const SubscriptionStateDefn &entry)
        {
            if (streamId == entry.m_streamId)
            {
                std::shared_ptr<Subscription> subscription = entry.m_subscription.lock();

                if (subscription != nullptr &&
                    !(subscription->hasImage(correlationId)) &&
                    subscriberPositionRegistrationId == subscription->registrationId())
                {
                    std::shared_ptr<LogBuffers> logBuffers = std::make_shared<LogBuffers>(logFilename.c_str());

                    UnsafeBufferPosition subscriberPosition(m_counterValuesBuffer, subscriberPositionIndicatorId);

                    Image image(
                        sessionId,
                        correlationId,
                        subscription->registrationId(),
                        sourceIdentity,
                        subscriberPosition,
                        logBuffers,
                        m_errorHandler);

                    entry.m_onAvailableImageHandler(image);

                    struct ImageList *oldImageList = subscription->addImage(image);

                    if (nullptr != oldImageList)
                    {
                        lingerResource(m_epochClock(), oldImageList);
                    }
                }
            }
        });
}